

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

ssize_t __thiscall
nuraft::asio_rpc_client::send(asio_rpc_client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  int iVar2;
  ssize_t extraout_RAX;
  element_type *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  options *poVar6;
  element_type *peVar7;
  buffer *pbVar8;
  element_type *peVar9;
  size_t sVar10;
  ulong uVar11;
  element_type *peVar12;
  socket *tcp_socket;
  ssize_t extraout_RAX_00;
  int __type;
  int iVar13;
  undefined4 in_register_00000034;
  char *pcVar14;
  shared_ptr<nuraft::asio_rpc_client> sVar15;
  shared_ptr<nuraft::buffer> *it;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  *__range2_1;
  uint64_t flags_and_crc;
  uint32_t crc_val;
  byte marker;
  byte *req_buf_data;
  ptr<buffer> req_buf;
  string meta_str;
  size_t meta_size;
  buffer_serializer ss;
  ptr<buffer> entry_buf;
  ptr<log_entry> *le;
  shared_ptr<nuraft::log_entry> *entry;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *__range2;
  size_t LOG_ENTRY_SIZE;
  uint32_t flags;
  int32 log_data_size;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  log_entry_bufs;
  ptr<asio::steady_timer> timer_1;
  ptr<asio::steady_timer> timer;
  bool desired;
  bool exp;
  ptr<asio_rpc_client> self;
  ptr<rpc_exception> except;
  ptr<resp_msg> rsp;
  memory_order __b_1;
  memory_order __b;
  _Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>))(const_std::error_code_&)>
  *in_stack_fffffffffffff708;
  duration dVar16;
  strfmt<200> *in_stack_fffffffffffff710;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *pbVar17;
  _Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>
  *func;
  anon_class_80_5_44425651 *in_stack_fffffffffffff718;
  asio_service_meta_cb_params *in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff728;
  int32_t in_stack_fffffffffffff72c;
  undefined4 uVar18;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>)>
  *in_stack_fffffffffffff730;
  ssl_socket *__args;
  shared_ptr<nuraft::asio_rpc_client> *in_stack_fffffffffffff738;
  socket *__f;
  buffer *in_stack_fffffffffffff740;
  offset_in_asio_rpc_client_to_subr *in_stack_fffffffffffff748;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffff750;
  _Placeholder<2> *in_stack_fffffffffffff758;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *in_stack_fffffffffffff760;
  atomic<bool> *in_stack_fffffffffffff768;
  _Placeholder<1> *in_stack_fffffffffffff770;
  undefined8 in_stack_fffffffffffff788;
  undefined1 to;
  asio_rpc_client *in_stack_fffffffffffff790;
  rpc_handler *in_stack_fffffffffffff858;
  string *in_stack_fffffffffffff860;
  string *in_stack_fffffffffffff868;
  ptr<req_msg> *in_stack_fffffffffffff870;
  ptr<asio_rpc_client> *in_stack_fffffffffffff878;
  asio_rpc_client *in_stack_fffffffffffff880;
  uint64_t in_stack_fffffffffffff890;
  atomic<unsigned_long> *paVar19;
  duration<long,std::ratio<1l,1000l>> local_5b0 [8];
  rep local_5a8;
  reference local_5a0;
  shared_ptr<nuraft::buffer> *local_598;
  __normal_iterator<std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
  local_590;
  undefined1 *local_588;
  undefined8 local_580;
  uint32_t local_578;
  undefined1 local_571;
  byte *local_570;
  string local_528 [32];
  string local_508 [32];
  long local_4e8;
  reference local_4b8;
  reference local_4b0;
  shared_ptr<nuraft::log_entry> *local_4a8;
  __normal_iterator<std::shared_ptr<nuraft::log_entry>_*,_std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
  local_4a0;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *local_498;
  long local_490;
  uint local_488;
  int local_484;
  undefined1 local_480 [24];
  asio_rpc_client *local_468;
  code *local_460;
  undefined8 local_458;
  duration<long,std::ratio<1l,1000l>> local_3e0 [8];
  rep local_3d8;
  string local_3c0 [96];
  asio_rpc_client *local_360;
  service_type *local_318;
  string local_2f0 [36];
  undefined4 local_2cc;
  asio_rpc_client *local_2c8;
  code *local_2c0;
  undefined8 local_2b8;
  duration<long,std::ratio<1l,1000l>> local_240 [8];
  rep local_238;
  string local_220 [38];
  undefined1 local_1fa;
  undefined1 local_1f9;
  string local_1f8 [48];
  strfmt<200> local_1c8;
  char *local_f8;
  string local_c0 [32];
  undefined1 local_a0 [80];
  __int_type_conflict3 local_50;
  object_fns *local_48;
  undefined4 local_3c;
  target_fns *local_38;
  prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *local_30;
  __int_type_conflict3 local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  atomic<unsigned_long> *local_8;
  
  to = (undefined1)((ulong)in_stack_fffffffffffff788 >> 0x38);
  local_a0._20_4_ = in_register_00000034;
  local_a0._16_4_ = __fd;
  local_a0._0_8_ = __n;
  local_a0._8_8_ = __buf;
  local_a0._24_8_ = this;
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff718);
  iVar2 = (int)__n;
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3d996d);
      iVar2 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (1 < iVar2) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3d9993);
        uVar4 = std::__cxx11::string::c_str();
        uVar5 = std::__cxx11::string::c_str();
        pcVar14 = "disabled";
        if ((this->ssl_enabled_ & 1U) != 0) {
          pcVar14 = "enabled";
        }
        msg_if_given_abi_cxx11_
                  ((char *)local_c0,"client %p to %s:%s is already stale (SSL %s)",this,uVar4,uVar5,
                   pcVar14);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"send",1000,local_c0);
        std::__cxx11::string::~string(local_c0);
      }
    }
    std::shared_ptr<nuraft::resp_msg>::shared_ptr((shared_ptr<nuraft::resp_msg> *)0x3d9a8f);
    strfmt<200>::strfmt(&local_1c8,"abandoned client to %s");
    std::__cxx11::string::c_str();
    local_f8 = strfmt<200>::fmt<char_const*>
                         (in_stack_fffffffffffff710,(char *)in_stack_fffffffffffff708);
    cs_new<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((char **)in_stack_fffffffffffff718,
               (shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffff710);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)in_stack_fffffffffffff720,
               (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffff718,
               (shared_ptr<nuraft::rpc_exception> *)in_stack_fffffffffffff710);
    std::shared_ptr<nuraft::rpc_exception>::~shared_ptr
              ((shared_ptr<nuraft::rpc_exception> *)0x3d9b2e);
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x3d9b3b);
    return extraout_RAX;
  }
  iVar13 = (int)this + 8;
  sVar15 = std::enable_shared_from_this<nuraft::asio_rpc_client>::shared_from_this
                     ((enable_shared_from_this<nuraft::asio_rpc_client> *)in_stack_fffffffffffff708)
  ;
  socket(this,iVar13,
         (int)sVar15.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi,iVar2);
  bVar1 = asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::is_open
                    ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)in_stack_fffffffffffff710
                    );
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3d9c12);
      iVar2 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (4 < iVar2) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3d9c4b);
        uVar4 = std::__cxx11::string::c_str();
        uVar5 = std::__cxx11::string::c_str();
        msg_if_given_abi_cxx11_
                  ((char *)local_1f8,"socket %p to %s:%s is not opened yet",this,uVar4,uVar5);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"send",0x3f5,local_1f8);
        std::__cxx11::string::~string(local_1f8);
      }
    }
    local_1f9 = 0;
    local_1fa = 1;
    iVar2 = (int)&local_1f9;
    iVar13 = 5;
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      (in_stack_fffffffffffff768,(bool *)in_stack_fffffffffffff760,
                       SUB81((ulong)in_stack_fffffffffffff758 >> 0x38,0),
                       (memory_order)in_stack_fffffffffffff758);
    if (!bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
      if (bVar1) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3d9da6);
        iVar2 = (**(code **)(*(long *)peVar3 + 0x38))();
        if (2 < iVar2) {
          peVar3 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3d9ddf);
          uVar4 = std::__cxx11::string::c_str();
          uVar5 = std::__cxx11::string::c_str();
          paVar19 = &this->num_send_fails_;
          local_a0._68_4_ = 5;
          local_a0._72_8_ = paVar19;
          local_a0._64_4_ = std::operator&(memory_order_seq_cst,__memory_order_mask);
          if (local_a0._68_4_ - 1 < 2) {
            local_a0._56_8_ = (paVar19->super___atomic_base<unsigned_long>)._M_i;
          }
          else if (local_a0._68_4_ == 5) {
            local_a0._56_8_ = (paVar19->super___atomic_base<unsigned_long>)._M_i;
          }
          else {
            local_a0._56_8_ = (paVar19->super___atomic_base<unsigned_long>)._M_i;
          }
          msg_if_given_abi_cxx11_
                    ((char *)local_220,
                     "cannot send req as other thread is racing on opening connection to (%s:%s), count %zu"
                     ,uVar4,uVar5,local_a0._56_8_);
          (**(code **)(*(long *)peVar3 + 0x40))
                    (peVar3,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                     ,"send",0x401,local_220);
          std::__cxx11::string::~string(local_220);
        }
      }
      local_8 = &this->num_send_fails_;
      local_10 = 1;
      local_14 = 5;
      local_20 = 1;
      LOCK();
      local_28 = (local_8->super___atomic_base<unsigned_long>)._M_i;
      (local_8->super___atomic_base<unsigned_long>)._M_i =
           (local_8->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      asio_service_impl::get_io_svc(this->impl_);
      cs_new<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>,asio::io_context&>
                ((io_context *)in_stack_fffffffffffff708);
      std::
      __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3da0bb);
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>
                (local_240,&SEND_RETRY_MS);
      local_238 = (rep)std::chrono::
                       duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000l>>
                                 ((duration<long,_std::ratio<1L,_1000L>_> *)
                                  in_stack_fffffffffffff708);
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::expires_after((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                       *)in_stack_fffffffffffff730,
                      (duration *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      std::
      __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3da12c);
      local_2c0 = send_retry;
      local_2b8 = 0;
      pbVar17 = (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                 *)local_a0;
      dVar16.__r = local_a0._8_8_;
      local_2c8 = this;
      std::
      bind<void(nuraft::asio_rpc_client::*)(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&),nuraft::asio_rpc_client*,std::shared_ptr<nuraft::asio_rpc_client>&,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>&,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long&,std::_Placeholder<1>const&>
                (in_stack_fffffffffffff748,(asio_rpc_client **)in_stack_fffffffffffff740,
                 in_stack_fffffffffffff738,
                 (shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
                  *)in_stack_fffffffffffff730,
                 (shared_ptr<nuraft::req_msg> *)
                 CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                 in_stack_fffffffffffff760,(unsigned_long *)in_stack_fffffffffffff768,
                 in_stack_fffffffffffff770);
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
      ::
      async_wait<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>>
                (pbVar17,(_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>
                          *)dVar16.__r);
      std::
      _Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>
      ::~_Bind((_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>
                *)0x3da1e2);
      local_2cc = 1;
      std::
      shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
      ::~shared_ptr((shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
                     *)0x3da1fa);
      goto LAB_003db6eb;
    }
    socket(this,iVar2,__type,iVar13);
    bVar1 = asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::is_open
                      ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)
                       in_stack_fffffffffffff710);
    if (!bVar1) {
      asio_service_impl::get_options(this->impl_);
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>)>
                          *)0x3da3d8);
      if (bVar1) {
        asio_service_impl::get_options(this->impl_);
        local_360 = this;
        std::shared_ptr<nuraft::asio_rpc_client>::shared_ptr
                  ((shared_ptr<nuraft::asio_rpc_client> *)in_stack_fffffffffffff710,
                   (shared_ptr<nuraft::asio_rpc_client> *)in_stack_fffffffffffff708);
        std::shared_ptr<nuraft::req_msg>::shared_ptr
                  ((shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffff710,
                   (shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffff708);
        std::
        function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
        ::function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                    *)in_stack_fffffffffffff720,
                   (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                    *)in_stack_fffffffffffff718);
        local_318 = (service_type *)local_a0._0_8_;
        std::function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::error_code)>
        ::
        function<nuraft::asio_rpc_client::send(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&,std::error_code)_1_,void>
                  ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>
                    *)in_stack_fffffffffffff720,in_stack_fffffffffffff718);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>)>
        ::operator()(in_stack_fffffffffffff730,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff720,
                     (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>
                      *)in_stack_fffffffffffff718);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>
        ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>
                     *)0x3da4e4);
        send(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long)
        ::{lambda(std::__cxx11::string_const&,std::__cxx11::string_const&,std::error_code)#1}::
        ~error_code((anon_class_80_5_44425651 *)in_stack_fffffffffffff710);
      }
      else {
        std::shared_ptr<nuraft::asio_rpc_client>::shared_ptr
                  ((shared_ptr<nuraft::asio_rpc_client> *)in_stack_fffffffffffff710,
                   (shared_ptr<nuraft::asio_rpc_client> *)in_stack_fffffffffffff708);
        std::shared_ptr<nuraft::req_msg>::shared_ptr
                  ((shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffff710,
                   (shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffff708);
        std::
        function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
        ::function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                    *)in_stack_fffffffffffff720,
                   (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                    *)in_stack_fffffffffffff718);
        execute_resolver(in_stack_fffffffffffff880,in_stack_fffffffffffff878,
                         in_stack_fffffffffffff870,in_stack_fffffffffffff868,
                         in_stack_fffffffffffff860,in_stack_fffffffffffff858,
                         in_stack_fffffffffffff890);
        std::
        function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
        ::~function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                     *)0x3da62d);
        std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x3da63a);
        std::shared_ptr<nuraft::asio_rpc_client>::~shared_ptr
                  ((shared_ptr<nuraft::asio_rpc_client> *)0x3da647);
      }
      local_2cc = 1;
      goto LAB_003db6eb;
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3da2b6);
      iVar2 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (2 < iVar2) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3da2ef);
        uVar4 = std::__cxx11::string::c_str();
        uVar5 = std::__cxx11::string::c_str();
        msg_if_given_abi_cxx11_
                  ((char *)local_2f0,"race: socket to %s:%s is already opened, escape",uVar4,uVar5);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"send",0x417,local_2f0);
        std::__cxx11::string::~string(local_2f0);
      }
    }
  }
  if (((this->ssl_enabled_ & 1U) == 0) ||
     (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff718), bVar1))
  {
    set_busy_flag(in_stack_fffffffffffff790,(bool)to);
    std::__atomic_base<unsigned_long>::operator=
              ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff720,
               (__int_type_conflict3)in_stack_fffffffffffff718);
    std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              *)0x3dabec);
    local_484 = 0;
    local_488 = 0;
    local_490 = 0xd;
    poVar6 = asio_service_impl::get_options(this->impl_);
    if ((poVar6->replicate_log_timestamp_ & 1U) != 0) {
      local_490 = local_490 + 8;
      local_488 = local_488 | 4;
    }
    peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3dac5a);
    local_498 = req_msg::log_entries(peVar7);
    local_4a0._M_current =
         (shared_ptr<nuraft::log_entry> *)
         std::
         vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
         ::begin((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                  *)in_stack_fffffffffffff708);
    local_4a8 = (shared_ptr<nuraft::log_entry> *)
                std::
                vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ::end((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       *)in_stack_fffffffffffff708);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<nuraft::log_entry>_*,_std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
                               *)in_stack_fffffffffffff710,
                              (__normal_iterator<std::shared_ptr<nuraft::log_entry>_*,_std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
                               *)in_stack_fffffffffffff708), bVar1) {
      local_4b8 = __gnu_cxx::
                  __normal_iterator<std::shared_ptr<nuraft::log_entry>_*,_std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
                  ::operator*(&local_4a0);
      local_4b0 = local_4b8;
      std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x3dad06);
      pbVar8 = log_entry::get_buf((log_entry *)in_stack_fffffffffffff720);
      nuraft::buffer::size(pbVar8);
      nuraft::buffer::alloc((size_t)in_stack_fffffffffffff858);
      buffer_serializer::buffer_serializer
                ((buffer_serializer *)in_stack_fffffffffffff720,
                 (ptr<buffer> *)in_stack_fffffffffffff718,
                 (endianness)((ulong)in_stack_fffffffffffff710 >> 0x20));
      peVar9 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3dad77);
      log_entry::get_term(peVar9);
      buffer_serializer::put_u64
                ((buffer_serializer *)in_stack_fffffffffffff730,
                 CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      peVar9 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3dadad);
      log_entry::get_val_type(peVar9);
      buffer_serializer::put_u8
                ((buffer_serializer *)in_stack_fffffffffffff730,
                 (uint8_t)((uint)in_stack_fffffffffffff72c >> 0x18));
      poVar6 = asio_service_impl::get_options(this->impl_);
      if ((poVar6->replicate_log_timestamp_ & 1U) != 0) {
        peVar9 = std::
                 __shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3dadfe);
        log_entry::get_timestamp(peVar9);
        buffer_serializer::put_u64
                  ((buffer_serializer *)in_stack_fffffffffffff730,
                   CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      }
      std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x3dae75);
      pbVar8 = log_entry::get_buf((log_entry *)in_stack_fffffffffffff720);
      nuraft::buffer::size(pbVar8);
      buffer_serializer::put_i32
                ((buffer_serializer *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
      std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x3daec4);
      pbVar8 = log_entry::get_buf((log_entry *)in_stack_fffffffffffff720);
      nuraft::buffer::data_begin(pbVar8);
      std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x3daefa);
      pbVar8 = log_entry::get_buf((log_entry *)in_stack_fffffffffffff720);
      nuraft::buffer::size(pbVar8);
      buffer_serializer::put_raw
                ((buffer_serializer *)in_stack_fffffffffffff730,
                 (void *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                 (size_t)in_stack_fffffffffffff720);
      std::
      vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
      push_back((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                 *)in_stack_fffffffffffff720,(value_type *)in_stack_fffffffffffff718);
      peVar12 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3daf66);
      sVar10 = nuraft::buffer::size(peVar12);
      local_484 = (int)sVar10 + local_484;
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x3daf9b);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<nuraft::log_entry>_*,_std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
      ::operator++(&local_4a0);
    }
    local_4e8 = 0;
    std::__cxx11::string::string(local_508);
    asio_service_impl::get_options(this->impl_);
    bVar1 = std::function::operator_cast_to_bool
                      ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
                        *)0x3dafe6);
    if (bVar1) {
      asio_service_impl::get_options(this->impl_);
      req_to_params((ptr<req_msg> *)in_stack_fffffffffffff750.__r);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
      ::operator()((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
                    *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                   in_stack_fffffffffffff720);
      std::__cxx11::string::operator=(local_508,local_528);
      std::__cxx11::string::~string(local_528);
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        local_488 = local_488 | 1;
        local_4e8 = std::__cxx11::string::size();
        local_4e8 = local_4e8 + 4;
      }
    }
    nuraft::buffer::alloc((size_t)in_stack_fffffffffffff858);
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3db0ef);
    nuraft::buffer::pos((buffer *)in_stack_fffffffffffff730,
                        CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    peVar12 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3db10a);
    local_570 = nuraft::buffer::data(peVar12);
    local_571 = 0;
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3db141);
    nuraft::buffer::put(in_stack_fffffffffffff740,(byte)((ulong)in_stack_fffffffffffff738 >> 0x38));
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3db160);
    peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3db175);
    msg_base::get_type(&peVar7->super_msg_base);
    nuraft::buffer::put(in_stack_fffffffffffff740,(byte)((ulong)in_stack_fffffffffffff738 >> 0x38));
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3db19c);
    peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3db1b1);
    msg_base::get_src(&peVar7->super_msg_base);
    nuraft::buffer::put(in_stack_fffffffffffff740,(int32)((ulong)in_stack_fffffffffffff738 >> 0x20))
    ;
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3db1d7);
    peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3db1ec);
    msg_base::get_dst(&peVar7->super_msg_base);
    nuraft::buffer::put(in_stack_fffffffffffff740,(int32)((ulong)in_stack_fffffffffffff738 >> 0x20))
    ;
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3db212);
    peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3db227);
    msg_base::get_term(&peVar7->super_msg_base);
    nuraft::buffer::put(in_stack_fffffffffffff740,(ulong)in_stack_fffffffffffff738);
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3db24e);
    peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3db263);
    req_msg::get_last_log_term(peVar7);
    nuraft::buffer::put(in_stack_fffffffffffff740,(ulong)in_stack_fffffffffffff738);
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3db28a);
    peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3db29f);
    req_msg::get_last_log_idx(peVar7);
    nuraft::buffer::put(in_stack_fffffffffffff740,(ulong)in_stack_fffffffffffff738);
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3db2c6);
    peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3db2db);
    req_msg::get_commit_idx(peVar7);
    nuraft::buffer::put(in_stack_fffffffffffff740,(ulong)in_stack_fffffffffffff738);
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3db302);
    nuraft::buffer::put(in_stack_fffffffffffff740,(int32)((ulong)in_stack_fffffffffffff738 >> 0x20))
    ;
    local_578 = crc32_8(local_570,0x2e,0);
    local_580 = CONCAT44(local_488,local_578);
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3db36b);
    nuraft::buffer::put(in_stack_fffffffffffff740,(ulong)in_stack_fffffffffffff738);
    if ((local_488 & 1) != 0) {
      std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x3db399);
      std::__cxx11::string::data();
      std::__cxx11::string::size();
      nuraft::buffer::put((buffer *)in_stack_fffffffffffff750.__r,(byte *)in_stack_fffffffffffff748,
                          (size_t)in_stack_fffffffffffff740);
    }
    local_588 = local_480;
    local_590._M_current =
         (shared_ptr<nuraft::buffer> *)
         std::
         vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
         ::begin((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                  *)in_stack_fffffffffffff708);
    local_598 = (shared_ptr<nuraft::buffer> *)
                std::
                vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ::end((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                       *)in_stack_fffffffffffff708);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
                               *)in_stack_fffffffffffff710,
                              (__normal_iterator<std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
                               *)in_stack_fffffffffffff708), bVar1) {
      local_5a0 = __gnu_cxx::
                  __normal_iterator<std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
                  ::operator*(&local_590);
      peVar12 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3db465);
      std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_fffffffffffff710);
      nuraft::buffer::put(peVar12,(buffer *)in_stack_fffffffffffff758);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
      ::operator++(&local_590);
    }
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3db4a4);
    nuraft::buffer::pos((buffer *)in_stack_fffffffffffff730,
                        CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    if ((service_type *)local_a0._0_8_ != (service_type *)0x0) {
      in_stack_fffffffffffff758 = (_Placeholder<2> *)&this->operation_timer_;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>
                (local_5b0,(unsigned_long *)local_a0);
      in_stack_fffffffffffff750 =
           std::chrono::
           duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000l>>
                     ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff708);
      local_5a8 = in_stack_fffffffffffff750.__r;
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::expires_after((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                       *)in_stack_fffffffffffff730,
                      (duration *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      std::
      bind<void(nuraft::asio_rpc_client::*)(std::error_code_const&),nuraft::asio_rpc_client*,std::_Placeholder<1>const&>
                ((offset_in_asio_rpc_client_to_subr *)in_stack_fffffffffffff718,
                 (asio_rpc_client **)in_stack_fffffffffffff710,
                 (_Placeholder<1> *)in_stack_fffffffffffff708);
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
      ::
      async_wait<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>))(std::error_code_const&)>>
                ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                  *)in_stack_fffffffffffff710,in_stack_fffffffffffff708);
    }
    uVar18 = CONCAT13(this->ssl_enabled_,(int3)in_stack_fffffffffffff72c);
    __args = &this->ssl_socket_;
    __f = &this->socket_;
    peVar12 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3db5cd);
    nuraft::buffer::data(peVar12);
    peVar12 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3db5e9);
    tcp_socket = (socket *)nuraft::buffer::size(peVar12);
    asio::buffer(in_stack_fffffffffffff710,(size_t)in_stack_fffffffffffff708);
    func = (_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>
            *)&std::placeholders::_2;
    std::
    bind<void(nuraft::asio_rpc_client::*)(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::error_code,unsigned_long),std::shared_ptr<nuraft::asio_rpc_client>&,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              ((offset_in_asio_rpc_client_to_subr *)__f,
               (shared_ptr<nuraft::asio_rpc_client> *)__args,
               (shared_ptr<nuraft::req_msg> *)CONCAT44(uVar18,in_stack_fffffffffffff728),
               (shared_ptr<nuraft::buffer> *)tcp_socket,
               (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)in_stack_fffffffffffff718,(_Placeholder<1> *)in_stack_fffffffffffff750.__r,
               in_stack_fffffffffffff758);
    aa::
    write<asio::mutable_buffers_1,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::buffer>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::error_code,unsigned_long)>>
              (SUB81((ulong)__args >> 0x38,0),
               (ssl_socket *)CONCAT44(uVar18,in_stack_fffffffffffff728),tcp_socket,
               (mutable_buffers_1 *)in_stack_fffffffffffff718,func);
    std::
    _Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>
    ::~_Bind((_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>
              *)0x3db6b9);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x3db6c6);
    std::__cxx11::string::~string(local_508);
    std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
               *)tcp_socket);
    local_2cc = 0;
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->l_);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3da711);
      iVar2 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (2 < iVar2) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3da74a);
        uVar4 = std::__cxx11::string::c_str();
        uVar5 = std::__cxx11::string::c_str();
        paVar19 = &this->num_send_fails_;
        local_a0._44_4_ = 5;
        local_a0._48_8_ = paVar19;
        local_a0._40_4_ = std::operator&(memory_order_seq_cst,__memory_order_mask);
        if (local_a0._44_4_ - 1 < 2) {
          local_a0._32_8_ = (paVar19->super___atomic_base<unsigned_long>)._M_i;
        }
        else if (local_a0._44_4_ == 5) {
          local_a0._32_8_ = (paVar19->super___atomic_base<unsigned_long>)._M_i;
        }
        else {
          local_a0._32_8_ = (paVar19->super___atomic_base<unsigned_long>)._M_i;
        }
        msg_if_given_abi_cxx11_
                  ((char *)local_3c0,"cannot send req as SSL is not ready yet (%s:%s), count %zu",
                   uVar4,uVar5,local_a0._32_8_);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"send",0x441,local_3c0);
        std::__cxx11::string::~string(local_3c0);
      }
    }
    local_30 = (prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)&this->num_send_fails_;
    local_38 = (target_fns *)0x1;
    local_3c = 5;
    local_48 = (object_fns *)0x1;
    LOCK();
    local_50 = (((atomic<unsigned_long> *)local_30)->super___atomic_base<unsigned_long>)._M_i;
    (((atomic<unsigned_long> *)local_30)->super___atomic_base<unsigned_long>)._M_i =
         (((atomic<unsigned_long> *)local_30)->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    asio_service_impl::get_io_svc(this->impl_);
    cs_new<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>,asio::io_context&>
              ((io_context *)in_stack_fffffffffffff708);
    std::
    __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3daa26);
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>
              (local_3e0,&SEND_RETRY_MS);
    local_3d8 = (rep)std::chrono::
                     duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000l>>
                               ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff708)
    ;
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::expires_after((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                     *)in_stack_fffffffffffff730,
                    (duration *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    std::
    __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3daa97);
    local_460 = send_retry;
    local_458 = 0;
    pbVar17 = (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
               *)local_a0;
    dVar16.__r = local_a0._8_8_;
    local_468 = this;
    std::
    bind<void(nuraft::asio_rpc_client::*)(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&),nuraft::asio_rpc_client*,std::shared_ptr<nuraft::asio_rpc_client>&,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>&,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long&,std::_Placeholder<1>const&>
              (in_stack_fffffffffffff748,(asio_rpc_client **)in_stack_fffffffffffff740,
               in_stack_fffffffffffff738,
               (shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
                *)in_stack_fffffffffffff730,
               (shared_ptr<nuraft::req_msg> *)
               CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
               in_stack_fffffffffffff760,(unsigned_long *)in_stack_fffffffffffff768,
               in_stack_fffffffffffff770);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
    ::
    async_wait<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>>
              (pbVar17,(_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>
                        *)dVar16.__r);
    std::
    _Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>
    ::~_Bind((_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>
              *)0x3dab4d);
    local_2cc = 1;
    std::
    shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
    ::~shared_ptr((shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
                   *)0x3dab65);
  }
LAB_003db6eb:
  std::shared_ptr<nuraft::asio_rpc_client>::~shared_ptr
            ((shared_ptr<nuraft::asio_rpc_client> *)0x3db6f8);
  return extraout_RAX_00;
}

Assistant:

virtual void send(ptr<req_msg>& req,
                      rpc_handler& when_done,
                      uint64_t send_timeout_ms = 0) __override__
    {
        if (abandoned_) {
            p_er( "client %p to %s:%s is already stale (SSL %s)",
                  this, host_.c_str(), port_.c_str(),
                  ( ssl_enabled_ ? "enabled" : "disabled" ) );
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
               ( cs_new<rpc_exception>
                 ( lstrfmt("abandoned client to %s").fmt(host_.c_str()),
                   req ) );
            when_done(rsp, except);
            return;
        }

        ptr<asio_rpc_client> self = this->shared_from_this();
        while (!socket().is_open()) { // Dummy one-time loop
            p_db( "socket %p to %s:%s is not opened yet",
                  this, host_.c_str(), port_.c_str() );

            // WARNING:
            //   Only one thread can establish connection at a time.
            //   Since we don't re-use RPC client upon connection failure,
            //   this flag will never be cleared.
            bool exp = false;
            bool desired = true;
            if (!attempting_conn_.compare_exchange_strong(exp, desired)) {
                // Other thread is attempting connection, just wait.
                p_wn( "cannot send req as other thread is racing on opening "
                      "connection to (%s:%s), count %zu",
                      host_.c_str(), port_.c_str(), num_send_fails_.load() );
                num_send_fails_.fetch_add(1);

                ptr<asio::steady_timer> timer =
                    cs_new<asio::steady_timer>(impl_->get_io_svc());
                timer->expires_after
                       ( std::chrono::duration_cast<std::chrono::nanoseconds>
                         ( std::chrono::milliseconds( SEND_RETRY_MS ) ) );
                timer->async_wait( std::bind( &asio_rpc_client::send_retry,
                                              this,
                                              self,
                                              timer,
                                              req,
                                              when_done,
                                              send_timeout_ms,
                                              std::placeholders::_1 ) );
                return;
            }

            if (socket().is_open()) {
                // Already opened, skip async_connect.
                p_wn("race: socket to %s:%s is already opened, escape",
                     host_.c_str(), port_.c_str());
                break;
            }

            if (impl_->get_options().custom_resolver_) {
                impl_->get_options().custom_resolver_(
                    host_,
                    port_,
                    [this, self, req, when_done, send_timeout_ms]
                    ( const std::string& resolved_host,
                      const std::string& resolved_port,
                      std::error_code err ) {
                        if (!err) {
                            p_in( "custom resolver: %s:%s to %s:%s",
                                  host_.c_str(), port_.c_str(),
                                  resolved_host.c_str(), resolved_port.c_str() );
                            execute_resolver(self, req, resolved_host, resolved_port,
                                             when_done, send_timeout_ms);
                        } else {
                            ptr<resp_msg> rsp;
                            ptr<rpc_exception> except
                               ( cs_new<rpc_exception>
                                       ( lstrfmt("failed to resolve host %s by given "
                                                 "custom resolver "
                                                 "due to error %d, %s")
                                                .fmt( host_.c_str(),
                                                      err.value(),
                                                      err.message().c_str() ),
                                         req ) );
                            when_done(rsp, except);
                        }
                    } );
            } else {
                execute_resolver(self, req, host_, port_, when_done, send_timeout_ms);
            }
            return;
        }

        if (ssl_enabled_ && !ssl_ready_) {
            // TCP socket is opened, but SSL handshake is not done yet.
            // Since other thread is doing it, this thread should just wait.
            p_wn( "cannot send req as SSL is not ready yet (%s:%s), count %zu",
                  host_.c_str(), port_.c_str(), num_send_fails_.load() );
            num_send_fails_.fetch_add(1);

            ptr<asio::steady_timer> timer =
                cs_new<asio::steady_timer>(impl_->get_io_svc());
            timer->expires_after
                   ( std::chrono::duration_cast<std::chrono::nanoseconds>
                     ( std::chrono::milliseconds( SEND_RETRY_MS ) ) );
            timer->async_wait( std::bind( &asio_rpc_client::send_retry,
                                          this,
                                          self,
                                          timer,
                                          req,
                                          when_done,
                                          send_timeout_ms,
                                          std::placeholders::_1 ) );
            return;
        }

        // Socket should be idle now. If not, it should be a bug.
        set_busy_flag(true);

        // If we reach here, that means connection is valid.
        // Reset the counter.
        num_send_fails_ = 0;

        // serialize req, send and read response
        std::vector<ptr<buffer>> log_entry_bufs;
        int32 log_data_size(0);

        uint32_t flags = 0x0;
        size_t LOG_ENTRY_SIZE = 8 + 1 + 4;
        if (impl_->get_options().replicate_log_timestamp_) {
            LOG_ENTRY_SIZE += 8;
            flags |= INCLUDE_LOG_TIMESTAMP;
        }

        for (auto& entry: req->log_entries()) {
            ptr<log_entry>& le = entry;
            ptr<buffer> entry_buf = buffer::alloc
                                    ( LOG_ENTRY_SIZE + le->get_buf().size() );
#if 0
            entry_buf->put( le->get_term() );
            entry_buf->put( (byte)le->get_val_type() );
            entry_buf->put( (int32)le->get_buf().size() );
            le->get_buf().pos(0);
            entry_buf->put( le->get_buf() );
            entry_buf->pos( 0 );
#else
            buffer_serializer ss(entry_buf);
            ss.put_u64( le->get_term() );
            ss.put_u8( le->get_val_type() );
            if (impl_->get_options().replicate_log_timestamp_) {
                ss.put_u64( le->get_timestamp() );
            }
            ss.put_i32( le->get_buf().size() );
            ss.put_raw( le->get_buf().data_begin(), le->get_buf().size() );
#endif
            log_entry_bufs.push_back(entry_buf);
            log_data_size += (int32)entry_buf->size();
        }

        size_t meta_size = 0;
        std::string meta_str;
        if (impl_->get_options().write_req_meta_) {
            meta_str = impl_->get_options().write_req_meta_( req_to_params(req) );
            if (!meta_str.empty()) {
                // If callback for meta is given, set flag.
                flags |= INCLUDE_META;
                meta_size = sizeof(int32) + meta_str.size();
            }
        }

        ptr<buffer> req_buf =
            buffer::alloc(RPC_REQ_HEADER_SIZE + meta_size + log_data_size);

        req_buf->pos(0);
        byte* req_buf_data = req_buf->data();

        byte marker = 0x0;
        req_buf->put(marker);
        req_buf->put((byte)req->get_type());
        req_buf->put(req->get_src());
        req_buf->put(req->get_dst());
        req_buf->put(req->get_term());
        req_buf->put(req->get_last_log_term());
        req_buf->put(req->get_last_log_idx());
        req_buf->put(req->get_commit_idx());
        req_buf->put((int32)meta_size + log_data_size);

        // Calculate CRC32 on header-only.
        uint32_t crc_val = crc32_8( req_buf_data,
                                    RPC_REQ_HEADER_SIZE - CRC_FLAGS_LEN,
                                    0 );

        uint64_t flags_and_crc = ((uint64_t)flags << 32) | crc_val;
        req_buf->put((ulong)flags_and_crc);

        // Handling meta if the flag is set.
        if (flags & INCLUDE_META) {
            req_buf->put( (byte*)meta_str.data(), meta_str.size() );
        }

        for (auto& it: log_entry_bufs) {
            req_buf->put(*(it));
        }
        req_buf->pos(0);

        if (send_timeout_ms != 0)
        {
            operation_timer_.expires_after
                   ( std::chrono::duration_cast<std::chrono::nanoseconds>
                     ( std::chrono::milliseconds( send_timeout_ms ) ) );
            operation_timer_.async_wait( std::bind( &asio_rpc_client::cancel_socket,
                                                    this,
                                                    std::placeholders::_1 ) );
        }


        // Note: without passing `req_buf` to callback function, it will be
        //       unreachable before the write is done so that it is freed
        //       and the memory corruption will occur.
        aa::write( ssl_enabled_, ssl_socket_, socket_,
                   asio::buffer(req_buf->data(), req_buf->size()),
                   std::bind( &asio_rpc_client::sent,
                              self,
                              req,
                              req_buf,
                              when_done,
                              std::placeholders::_1,
                              std::placeholders::_2 ) );
    }